

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::Curve::getPrimBounds(Curve *this,size_t param_2,affine3f *xfm)

{
  bool bVar1;
  reference pvVar2;
  float *pfVar3;
  vec3f *in_RSI;
  box3f *in_RDI;
  vec3f vVar4;
  vec3f maxWidth;
  vec3f p;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffff38;
  box3f *b;
  vec3f *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  vec3f *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vec3f local_6c;
  vec3f local_60;
  undefined8 local_4c;
  float local_44;
  undefined8 local_40;
  float local_38;
  vec3f *local_30;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_28;
  vec3f *local_20;
  
  b = in_RDI;
  math::box3f::empty_box();
  local_20 = in_RSI + 0xe;
  local_28._M_current =
       (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                          (in_stack_ffffffffffffff38);
  local_30 = (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end
                                (in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_RDI,
                       (__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    pvVar2 = __gnu_cxx::
             __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
             ::operator*(&local_28);
    local_38 = pvVar2->z;
    local_40._0_4_ = pvVar2->x;
    local_40._4_4_ = pvVar2->y;
    vVar4 = math::xfmPoint((affine3f *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                           ,in_stack_ffffffffffffff58);
    local_60._0_8_ = vVar4._0_8_;
    local_4c._0_4_ = local_60.x;
    local_4c._4_4_ = local_60.y;
    local_60.z = vVar4.z;
    local_44 = local_60.z;
    local_60 = vVar4;
    math::box3f::extend((box3f *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++(&local_28);
  }
  pfVar3 = std::max<float>(&in_RSI[0x10].x,&in_RSI[0x10].y);
  math::vec3f::vec3f(&local_6c,*pfVar3);
  vVar4 = math::operator-(in_RSI,&b->lower);
  (in_RDI->lower).z = vVar4.z;
  (in_RDI->lower).x = (float)(int)vVar4._0_8_;
  (in_RDI->lower).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  vVar4 = math::operator+(in_RSI,&b->lower);
  (in_RDI->upper).x = (float)(int)vVar4._0_8_;
  (in_RDI->upper).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  (in_RDI->upper).z = vVar4.z;
  return b;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(xfmPoint(xfm,p));
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }